

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O1

void __thiscall
rsg::ExpressionStatement::tokenize(ExpressionStatement *this,GeneratorState *state,TokenStream *str)

{
  size_t sVar1;
  size_t sVar2;
  Token local_28;
  Token local_18;
  
  (*this->m_expression->_vptr_Expression[3])();
  local_18.m_type = SEMICOLON;
  if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
              (&str->m_tokens,str->m_numTokens + 0x40);
  }
  Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_18);
  sVar2 = str->m_numTokens;
  sVar1 = sVar2 + 1;
  str->m_numTokens = sVar1;
  local_28.m_type = NEWLINE;
  if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_start >> 4 == sVar1) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar2 + 0x41);
  }
  Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_28);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_28);
  Token::~Token(&local_18);
  return;
}

Assistant:

void ExpressionStatement::tokenize (GeneratorState& state, TokenStream& str) const
{
	DE_ASSERT(m_expression);
	m_expression->tokenize(state, str);
	str << Token::SEMICOLON << Token::NEWLINE;
}